

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Regular::prepareNextState(Regular *this)

{
  Regular *this_local;
  
  this->regularCount = this->regularCount + -1;
  if (this->regularCount == 0) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochNextValue + 1.0;
    (this->super_StochasticEventGenerator).eventNextValue = true;
    this->regularCount = this->regularInterval;
  }
  else {
    (this->super_StochasticEventGenerator).eventNextValue = false;
  }
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  stochNextStateIsPrepared = true;
  return;
}

Assistant:

void Regular::prepareNextState()
{
	regularCount--;
	if (!regularCount) {
		stochNextValue += 1.0;
        eventNextValue = true;
		regularCount = regularInterval;
	}
	else
        eventNextValue = false;
	stochNextStateIsPrepared = true;
}